

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaVarIterator.cpp
# Opt level: O0

void __thiscall Kernel::FormulaVarIterator::FormulaVarIterator(FormulaVarIterator *this,Term *t)

{
  undefined1 *in_RDI;
  Stack<Kernel::TermList> *this_00;
  undefined1 *initialCapacity;
  Stack<const_Kernel::Term_*> *this_01;
  undefined4 in_stack_ffffffffffffff98;
  Instruction in_stack_ffffffffffffff9c;
  size_t in_stack_ffffffffffffffa8;
  Stack<const_Kernel::Term_*> *in_stack_ffffffffffffffb0;
  
  *in_RDI = 0;
  Lib::MultiCounter::MultiCounter((MultiCounter *)0x85b1f9);
  Lib::MultiCounter::MultiCounter((MultiCounter *)0x85b20c);
  Lib::Stack<const_Kernel::Formula_*>::Stack
            ((Stack<const_Kernel::Formula_*> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Lib::Stack<const_Kernel::Term_*>::Stack(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = (Stack<Kernel::TermList> *)(in_RDI + 0x78);
  Lib::Stack<Kernel::TermList>::Stack(this_00,in_stack_ffffffffffffffa8);
  initialCapacity = in_RDI + 0x98;
  Lib::Stack<Kernel::FormulaVarIterator::Instruction>::Stack
            ((Stack<Kernel::FormulaVarIterator::Instruction> *)this_00,(size_t)initialCapacity);
  this_01 = (Stack<const_Kernel::Term_*> *)(in_RDI + 0xb8);
  Lib::Stack<const_Lib::List<unsigned_int>_*>::Stack
            ((Stack<const_Lib::List<unsigned_int>_*> *)this_00,(size_t)initialCapacity);
  Lib::Stack<Kernel::FormulaVarIterator::Instruction>::push
            ((Stack<Kernel::FormulaVarIterator::Instruction> *)this_01,in_stack_ffffffffffffff9c);
  Lib::Stack<const_Kernel::Term_*>::push
            (this_01,(Term *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  return;
}

Assistant:

FormulaVarIterator::FormulaVarIterator(const Term* t)
  : _found(false)
{
  _instructions.push(FVI_TERM);
  _terms.push(t);
}